

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_base.c
# Opt level: O3

MPP_RET hal_vp8e_buf_free(void *hal)

{
  undefined8 *puVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  
  puVar1 = *(undefined8 **)((long)hal + 0x60);
  if ((MppBuffer)puVar1[3] != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller((MppBuffer)puVar1[3],"hal_vp8e_buf_free");
    puVar1[3] = 0;
  }
  lVar4 = 0;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    if ((MppBuffer)puVar1[lVar4 + 4] != (MppBuffer)0x0) {
      mpp_buffer_put_with_caller((MppBuffer)puVar1[lVar4 + 4],"hal_vp8e_buf_free");
      puVar1[lVar4 + 4] = 0;
    }
    lVar4 = 1;
    bVar2 = false;
  } while (bVar3);
  if ((MppBuffer)puVar1[7] != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller((MppBuffer)puVar1[7],"hal_vp8e_buf_free");
    puVar1[7] = 0;
  }
  if ((MppBuffer)puVar1[6] != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller((MppBuffer)puVar1[6],"hal_vp8e_buf_free");
    puVar1[6] = 0;
  }
  if ((MppBuffer)puVar1[10] != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller((MppBuffer)puVar1[10],"hal_vp8e_buf_free");
    puVar1[10] = 0;
  }
  if ((MppBuffer)puVar1[9] != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller((MppBuffer)puVar1[9],"hal_vp8e_buf_free");
    puVar1[9] = 0;
  }
  if ((MppBuffer)puVar1[8] != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller((MppBuffer)puVar1[8],"hal_vp8e_buf_free");
    puVar1[8] = 0;
  }
  if ((MppBuffer)puVar1[0xb] != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller((MppBuffer)puVar1[0xb],"hal_vp8e_buf_free");
    puVar1[0xb] = 0;
  }
  if ((MppBufferGroup)*puVar1 != (MppBufferGroup)0x0) {
    mpp_buffer_group_put((MppBufferGroup)*puVar1);
    *puVar1 = 0;
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_vp8e_buf_free(void *hal)
{
    HalVp8eCtx *ctx = (HalVp8eCtx *)hal;
    Vp8eVpuBuf *buffers = (Vp8eVpuBuf *)ctx->buffers;

    if (buffers->hw_luma_buf) {
        mpp_buffer_put(buffers->hw_luma_buf);
        buffers->hw_luma_buf = NULL;
    }

    {
        RK_U32 i = 0;
        for (i = 0; i < 2; i++) {
            if (buffers->hw_cbcr_buf[i]) {
                mpp_buffer_put(buffers->hw_cbcr_buf[i]);
                buffers->hw_cbcr_buf[i] = NULL;
            }
        }
    }

    if (buffers->hw_size_table_buf) {
        mpp_buffer_put(buffers->hw_size_table_buf);
        buffers->hw_size_table_buf = NULL;
    }

    if (buffers->hw_cabac_table_buf) {
        mpp_buffer_put(buffers->hw_cabac_table_buf);
        buffers->hw_cabac_table_buf = NULL;
    }

    if (buffers->hw_mv_output_buf) {
        mpp_buffer_put(buffers->hw_mv_output_buf);
        buffers->hw_mv_output_buf = NULL;
    }

    if (buffers->hw_prob_count_buf) {
        mpp_buffer_put(buffers->hw_prob_count_buf);
        buffers->hw_prob_count_buf = NULL;
    }

    if (buffers->hw_segment_map_buf) {
        mpp_buffer_put(buffers->hw_segment_map_buf);
        buffers->hw_segment_map_buf = NULL;
    }

    if (buffers->hw_out_buf) {
        mpp_buffer_put(buffers->hw_out_buf);
        buffers->hw_out_buf = NULL;
    }

    if (buffers->hw_buf_grp) {
        mpp_buffer_group_put(buffers->hw_buf_grp);
        buffers->hw_buf_grp = NULL;
    }

    return MPP_OK;
}